

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O2

void helper_neon_unzip8_aarch64(void *vd,void *vm)

{
  ulong uVar1;
  ulong uVar2;
  uint64_t *rm;
  uint64_t *rd;
  
  uVar1 = *vd;
  uVar2 = *vm;
  *(ulong *)vm = uVar2 & 0xff00000000000000 |
                 (ulong)((uint)(uVar1 >> 0x20) & 0xff000000) |
                 uVar1 >> 0x18 & 0xff0000 | uVar1 >> 0x10 & 0xff00 | uVar1 >> 8 & 0xff |
                 uVar2 << 0x18 & 0xff00000000 | uVar2 << 0x10 & 0xff0000000000 |
                 uVar2 << 8 & 0xff000000000000;
  *(ulong *)vd = uVar2 << 8 & 0xff00000000000000 |
                 uVar2 << 0x10 & 0xff000000000000 |
                 uVar2 << 0x18 & 0xff0000000000 |
                 (uVar2 & 0xff) << 0x20 |
                 (ulong)((uint)(uVar1 >> 0x18) & 0xff000000) |
                 uVar1 >> 0x10 & 0xff0000 | uVar1 >> 8 & 0xff00 | uVar1 & 0xff;
  return;
}

Assistant:

void HELPER(neon_unzip8)(void *vd, void *vm)
{
    uint64_t *rd = vd, *rm = vm;
    uint64_t zd = rd[0], zm = rm[0];

    uint64_t d0 = ELEM(zd, 0, 8) | (ELEM(zd, 2, 8) << 8)
        | (ELEM(zd, 4, 8) << 16) | (ELEM(zd, 6, 8) << 24)
        | (ELEM(zm, 0, 8) << 32) | (ELEM(zm, 2, 8) << 40)
        | (ELEM(zm, 4, 8) << 48) | (ELEM(zm, 6, 8) << 56);
    uint64_t m0 = ELEM(zd, 1, 8) | (ELEM(zd, 3, 8) << 8)
        | (ELEM(zd, 5, 8) << 16) | (ELEM(zd, 7, 8) << 24)
        | (ELEM(zm, 1, 8) << 32) | (ELEM(zm, 3, 8) << 40)
        | (ELEM(zm, 5, 8) << 48) | (ELEM(zm, 7, 8) << 56);

    rm[0] = m0;
    rd[0] = d0;
}